

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8 StringBuilder<int>(int *arg)

{
  undefined8 in_RDI;
  int in_stack_0000003c;
  
  std::__cxx11::to_string(in_stack_0000003c);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg)
{
    return std::to_string(arg);
}